

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall ON_3dmConstructionPlane::ON_3dmConstructionPlane(ON_3dmConstructionPlane *this)

{
  ON_3dmConstructionPlane *this_local;
  
  ON_Plane::ON_Plane(&this->m_plane);
  ON_wString::ON_wString(&this->m_name);
  Default(this);
  return;
}

Assistant:

ON_3dmConstructionPlane::ON_3dmConstructionPlane()
{
  Default();
}